

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng.cc
# Opt level: O1

void __thiscall S2LatLng::S2LatLng(S2LatLng *this,S2Point *p)

{
  double dVar1;
  double dVar2;
  S2LogMessage local_20;
  
  dVar1 = p->c_[2];
  dVar2 = p->c_[1] * p->c_[1] + p->c_[0] * p->c_[0];
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar1 = atan2(dVar1,dVar2);
  dVar2 = atan2(p->c_[1],p->c_[0]);
  (this->coords_).c_[0] = dVar1;
  (this->coords_).c_[1] = dVar2;
  if ((1.5707963267948966 < ABS(dVar1)) || (3.141592653589793 < ABS(dVar2))) {
    S2LogMessage::S2LogMessage
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng.cc"
               ,0x30,kError,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_20.stream_,"Invalid S2LatLng in constructor: ",0x21);
    ::operator<<(local_20.stream_,this);
    S2LogMessage::~S2LogMessage(&local_20);
  }
  return;
}

Assistant:

S2LatLng::S2LatLng(const S2Point& p)
  : coords_(Latitude(p).radians(), Longitude(p).radians()) {
  // The latitude and longitude are already normalized.
  S2_DLOG_IF(ERROR, !is_valid())
      << "Invalid S2LatLng in constructor: " << *this;
}